

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  UserData webdata_00;
  N_Vector p_Var3;
  sunrealtype **ppsVar4;
  UserData webdata_01;
  undefined8 uVar5;
  undefined8 uVar6;
  SUNContext ctx;
  SUNLinearSolver LS;
  SUNMatrix A;
  sunrealtype tret;
  sunrealtype tout;
  sunrealtype t0;
  sunrealtype atol;
  sunrealtype rtol;
  sunindextype ml;
  sunindextype mu;
  int retval;
  int iout;
  N_Vector id;
  N_Vector cp;
  N_Vector cc;
  UserData webdata;
  void *mem;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *pcVar7;
  void *pvVar8;
  sunindextype in_stack_ffffffffffffff90;
  double local_68;
  sunrealtype t;
  undefined1 *mem_00;
  void *mem_01;
  int local_34;
  N_Vector p_Var9;
  int local_4;
  
  p_Var9 = (N_Vector)0x0;
  pvVar8 = (void *)0x0;
  pcVar7 = (char *)0x0;
  SUNContext_Create(0,&stack0xffffffffffffff78);
  iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
  if (iVar1 == 0) {
    webdata_00 = (UserData)malloc(0x78);
    p_Var3 = (N_Vector)
             N_VNew_Serial(800,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    webdata_00->rates = p_Var3;
    ppsVar4 = (sunrealtype **)SUNDlsMat_newDenseMat(2);
    webdata_00->acoef = ppsVar4;
    InitUserData(webdata_00);
    p_Var3 = (N_Vector)
             N_VNew_Serial(800,CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
    if (iVar1 == 0) {
      webdata_01 = (UserData)N_VClone(p_Var3);
      iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
      if (iVar1 == 0) {
        uVar5 = N_VClone(p_Var3);
        iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
        if (iVar1 == 0) {
          SetInitialProfiles(p_Var9,(N_Vector)webdata_00,p_Var3,webdata_01);
          t = 0.0;
          mem_00 = &DAT_3ee4f8b588e368f1;
          p_Var9 = (N_Vector)&DAT_3ee4f8b588e368f1;
          uVar6 = IDACreate(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
          iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
          if (iVar1 == 0) {
            IDASetUserData(uVar6,webdata_00);
            iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
            if (iVar1 == 0) {
              IDASetId(uVar6,uVar5);
              iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
              if (iVar1 == 0) {
                IDAInit(t,uVar6,resweb,p_Var3,webdata_01);
                iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                if (iVar1 == 0) {
                  IDASStolerances(mem_00,p_Var9,uVar6);
                  iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                  if (iVar1 == 0) {
                    mem_01 = (void *)0x28;
                    pvVar8 = (void *)SUNBandMatrix(800,0x28,0x28,
                                                   CONCAT44(in_stack_ffffffffffffff7c,
                                                            in_stack_ffffffffffffff78));
                    iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                    if (iVar1 == 0) {
                      pcVar7 = (char *)SUNLinSol_Band(p_Var3,pvVar8,
                                                      CONCAT44(in_stack_ffffffffffffff7c,
                                                               in_stack_ffffffffffffff78));
                      iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                      if (iVar1 == 0) {
                        IDASetLinearSolver(uVar6,pcVar7,pvVar8);
                        iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                        if (iVar1 == 0) {
                          local_68 = 0.001;
                          IDACalcIC(0x3f50624dd2f1a9fc,uVar6,1);
                          iVar1 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                          if (iVar1 == 0) {
                            PrintHeader(in_stack_ffffffffffffff90,(sunindextype)pvVar8,
                                        (sunrealtype)pcVar7,
                                        (sunrealtype)
                                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                                                ));
                            PrintOutput(mem_00,p_Var9,t);
                            for (local_34 = 1; local_34 < 7; local_34 = local_34 + 1) {
                              iVar1 = IDASolve(local_68,uVar6,&stack0xffffffffffffff90,p_Var3,
                                               webdata_01,1);
                              iVar2 = check_retval(pvVar8,pcVar7,in_stack_ffffffffffffff7c);
                              if (iVar2 != 0) {
                                return iVar1;
                              }
                              PrintOutput(mem_00,p_Var9,t);
                              if (local_34 < 3) {
                                local_68 = local_68 * 10.0;
                              }
                              else {
                                local_68 = local_68 + 0.3;
                              }
                            }
                            PrintFinalStats(mem_01);
                            IDAFree(&stack0xfffffffffffffff0);
                            SUNLinSolFree(pcVar7);
                            SUNMatDestroy(pvVar8);
                            N_VDestroy(p_Var3);
                            N_VDestroy(webdata_01);
                            N_VDestroy(uVar5);
                            SUNDlsMat_destroyMat(webdata_00->acoef);
                            N_VDestroy(webdata_00->rates);
                            free(webdata_00);
                            SUNContext_Free(&stack0xffffffffffffff78);
                            local_4 = 0;
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  void* mem;
  UserData webdata;
  N_Vector cc, cp, id;
  int iout, retval;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem     = NULL;
  webdata = NULL;
  cc = cp = id = NULL;
  A            = NULL;
  LS           = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate and initialize user data block webdata. */

  webdata        = (UserData)malloc(sizeof *webdata);
  webdata->rates = N_VNew_Serial(NEQ, ctx);
  webdata->acoef = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);

  InitUserData(webdata);

  /* Allocate N-vectors and initialize cc, cp, and id. */

  cc = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)cc, "N_VNew_Serial", 0)) { return (1); }

  cp = N_VClone(cc);
  if (check_retval((void*)cp, "N_VNew_Serial", 0)) { return (1); }

  id = N_VClone(cc);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  SetInitialProfiles(cc, cp, id, webdata);

  /* Set remaining inputs to IDAMalloc. */

  t0   = ZERO;
  rtol = RTOL;
  atol = ATOL;

  /* Call IDACreate and IDAMalloc to initialize IDA. */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, webdata);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDAInit(mem, resweb, t0, cc, cp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = ml = NSMX;
  A       = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(cc, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC (with default options) to correct the initial values. */

  tout   = SUN_RCONST(0.001);
  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, tout);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print heading, basic parameters, and initial values. */

  PrintHeader(mu, ml, rtol, atol);
  PrintOutput(mem, cc, ZERO);

  /* Loop over iout, call IDASolve (normal mode), print selected output. */

  for (iout = 1; iout <= NOUT; iout++)
  {
    retval = IDASolve(mem, tout, &tret, cc, cp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (retval); }

    PrintOutput(mem, cc, tret);

    if (iout < 3) { tout *= TMULT; }
    else { tout += TADD; }
  }

  /* Print final statistics and free memory. */

  PrintFinalStats(mem);

  /* Free memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(cc);
  N_VDestroy(cp);
  N_VDestroy(id);

  SUNDlsMat_destroyMat(webdata->acoef);
  N_VDestroy(webdata->rates);
  free(webdata);

  SUNContext_Free(&ctx);

  return (0);
}